

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
boost::exception_detail::error_info_injector<boost::system::system_error>::error_info_injector
          (error_info_injector<boost::system::system_error> *this,system_error *x)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  std::runtime_error::runtime_error((runtime_error *)this,&x->super_runtime_error);
  *(undefined ***)&this->super_system_error = &PTR__system_error_001cb398;
  uVar2 = *(undefined4 *)&(x->m_error_code).field_0x4;
  uVar3 = *(undefined4 *)&(x->m_error_code).m_cat;
  uVar4 = *(undefined4 *)((long)&(x->m_error_code).m_cat + 4);
  (this->super_system_error).m_error_code.m_val = (x->m_error_code).m_val;
  *(undefined4 *)&(this->super_system_error).m_error_code.field_0x4 = uVar2;
  *(undefined4 *)&(this->super_system_error).m_error_code.m_cat = uVar3;
  *(undefined4 *)((long)&(this->super_system_error).m_error_code.m_cat + 4) = uVar4;
  (this->super_system_error).m_what._M_dataplus._M_p =
       (pointer)&(this->super_system_error).m_what.field_2;
  pcVar1 = (x->m_what)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_system_error).m_what,pcVar1,
             pcVar1 + (x->m_what)._M_string_length);
  (this->super_exception).data_.px_ = (error_info_container *)0x0;
  (this->super_exception).throw_function_ = (char *)0x0;
  (this->super_exception).throw_file_ = (char *)0x0;
  (this->super_exception).throw_line_ = -1;
  *(undefined ***)&this->super_system_error = &PTR__error_info_injector_001cddc8;
  (this->super_exception)._vptr_exception = (_func_int **)&PTR__error_info_injector_001cddf0;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }